

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window)

{
  uint uVar1;
  ImGuiPopupRef *pIVar2;
  ImGuiWindow *pIVar3;
  ulong uVar4;
  int m;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar4 = (ulong)uVar1;
  if (uVar4 != 0) {
    uVar6 = 0;
    if ((ref_window == (ImGuiWindow *)0x0) || ((int)uVar1 < 1)) {
LAB_00119819:
      if ((int)uVar6 < (int)uVar1) {
        ClosePopupToLevel((int)uVar6,false);
        return;
      }
    }
    else {
      pIVar2 = (GImGui->OpenPopupStack).Data;
      uVar6 = 0;
      do {
        pIVar3 = pIVar2[uVar6].Window;
        if ((pIVar3 != (ImGuiWindow *)0x0) && (uVar5 = uVar6, (pIVar3->Flags & 0x1000000) == 0)) {
          do {
            while (pIVar3 = pIVar2[uVar5].Window, pIVar3 == (ImGuiWindow *)0x0) {
              uVar5 = uVar5 + 1;
              if (uVar4 <= uVar5) goto LAB_00119819;
            }
            pIVar3 = pIVar3->RootWindow;
          } while ((uVar5 + 1 < uVar4) && (uVar5 = uVar5 + 1, pIVar3 != ref_window->RootWindow));
          if (pIVar3 != ref_window->RootWindow) goto LAB_00119819;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar4);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupRef& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack if popups are not direct descendant of the reference window (which is often the NavWindow)
            bool popup_or_descendent_has_focus = false;
            for (int m = popup_count_to_keep; m < g.OpenPopupStack.Size && !popup_or_descendent_has_focus; m++)
                if (g.OpenPopupStack[m].Window && g.OpenPopupStack[m].Window->RootWindow == ref_window->RootWindow)
                    popup_or_descendent_has_focus = true;
            if (!popup_or_descendent_has_focus)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        //IMGUI_DEBUG_LOG("ClosePopupsOverWindow(%s) -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, false);
    }
}